

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bitstr.cc
# Opt level: O0

ASN1_BIT_STRING * c2i_ASN1_BIT_STRING(ASN1_BIT_STRING **a,uchar **pp,long length)

{
  byte bVar1;
  uint uVar2;
  size_t size;
  uint8_t padding_mask;
  void *pvStack_40;
  int padding;
  uchar *s;
  uchar *p;
  ASN1_BIT_STRING *ret;
  long len_local;
  uchar **pp_local;
  ASN1_BIT_STRING **a_local;
  
  p = (uchar *)0x0;
  if (length < 1) {
    ERR_put_error(0xc,0,0xae,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_bitstr.cc"
                  ,0x7a);
  }
  else if (length < 0x80000000) {
    if ((a == (ASN1_BIT_STRING **)0x0) || (*a == (ASN1_BIT_STRING *)0x0)) {
      p = (uchar *)ASN1_BIT_STRING_new();
      if ((ASN1_BIT_STRING *)p == (ASN1_BIT_STRING *)0x0) {
        return (ASN1_BIT_STRING *)0x0;
      }
    }
    else {
      p = (uchar *)*a;
    }
    s = *pp + 1;
    bVar1 = **pp;
    uVar2 = (uint)bVar1;
    size = length - 1;
    if (uVar2 < 8) {
      if ((uVar2 == 0) ||
         ((0 < (long)size && ((s[length + -2] & (char)(1 << (bVar1 & 0x1f)) - 1U) == 0)))) {
        *(ulong *)(p + 0x10) = *(ulong *)(p + 0x10) & 0xfffffffffffffff0;
        *(ulong *)(p + 0x10) = (long)(int)(uVar2 | 8) | *(ulong *)(p + 0x10);
        if ((long)size < 1) {
          pvStack_40 = (void *)0x0;
        }
        else {
          pvStack_40 = OPENSSL_memdup(s,size);
          if (pvStack_40 == (void *)0x0) goto LAB_002eefd0;
          s = s + size;
        }
        *(int *)p = (int)size;
        OPENSSL_free(*(void **)(p + 8));
        *(void **)(p + 8) = pvStack_40;
        p[4] = '\x03';
        p[5] = '\0';
        p[6] = '\0';
        p[7] = '\0';
        if (a != (ASN1_BIT_STRING **)0x0) {
          *a = (ASN1_BIT_STRING *)p;
        }
        *pp = s;
        return (ASN1_BIT_STRING *)p;
      }
      ERR_put_error(0xc,0,0xc2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_bitstr.cc"
                    ,0x96);
    }
    else {
      ERR_put_error(0xc,0,0x8d,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_bitstr.cc"
                    ,0x8f);
    }
  }
  else {
    ERR_put_error(0xc,0,0xad,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_bitstr.cc"
                  ,0x7f);
  }
LAB_002eefd0:
  if ((p != (uchar *)0x0) && ((a == (ASN1_BIT_STRING **)0x0 || (*a != (ASN1_BIT_STRING *)p)))) {
    ASN1_BIT_STRING_free((ASN1_BIT_STRING *)p);
  }
  return (ASN1_BIT_STRING *)0x0;
}

Assistant:

ASN1_BIT_STRING *c2i_ASN1_BIT_STRING(ASN1_BIT_STRING **a,
                                     const unsigned char **pp, long len) {
  ASN1_BIT_STRING *ret = NULL;
  const unsigned char *p;
  unsigned char *s;
  int padding;
  uint8_t padding_mask;

  if (len < 1) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_STRING_TOO_SHORT);
    goto err;
  }

  if (len > INT_MAX) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_STRING_TOO_LONG);
    goto err;
  }

  if ((a == NULL) || ((*a) == NULL)) {
    if ((ret = ASN1_BIT_STRING_new()) == NULL) {
      return NULL;
    }
  } else {
    ret = (*a);
  }

  p = *pp;
  padding = *(p++);
  len--;
  if (padding > 7) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_BIT_STRING_BITS_LEFT);
    goto err;
  }

  // Unused bits in a BIT STRING must be zero.
  padding_mask = (1 << padding) - 1;
  if (padding != 0 && (len < 1 || (p[len - 1] & padding_mask) != 0)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_BIT_STRING_PADDING);
    goto err;
  }

  // We do this to preserve the settings.  If we modify the settings, via
  // the _set_bit function, we will recalculate on output
  ret->flags &= ~(ASN1_STRING_FLAG_BITS_LEFT | 0x07);    // clear
  ret->flags |= (ASN1_STRING_FLAG_BITS_LEFT | padding);  // set

  if (len > 0) {
    s = reinterpret_cast<uint8_t *>(OPENSSL_memdup(p, len));
    if (s == NULL) {
      goto err;
    }
    p += len;
  } else {
    s = NULL;
  }

  ret->length = (int)len;
  OPENSSL_free(ret->data);
  ret->data = s;
  ret->type = V_ASN1_BIT_STRING;
  if (a != NULL) {
    (*a) = ret;
  }
  *pp = p;
  return ret;
err:
  if ((ret != NULL) && ((a == NULL) || (*a != ret))) {
    ASN1_BIT_STRING_free(ret);
  }
  return NULL;
}